

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgamma.c
# Opt level: O2

int get_video_args(char **argv,int *w,int *h,int *bpp,Uint32 *flags)

{
  char *__s1;
  int iVar1;
  int *piVar2;
  int iVar3;
  
  *w = 0x280;
  *h = 0x1e0;
  *bpp = 0;
  *flags = 0;
  iVar3 = 1;
  do {
    __s1 = argv[iVar3];
    if (__s1 == (char *)0x0) {
      return iVar3;
    }
    iVar1 = strcmp(__s1,"-width");
    if (iVar1 == 0) {
      if (argv[(long)iVar3 + 1] != (char *)0x0) {
        iVar1 = atoi(argv[(long)iVar3 + 1]);
        piVar2 = w;
LAB_00101407:
        iVar3 = iVar3 + 1;
        *piVar2 = iVar1;
      }
    }
    else {
      iVar1 = strcmp(__s1,"-height");
      if (iVar1 == 0) {
        if (argv[(long)iVar3 + 1] != (char *)0x0) {
          iVar1 = atoi(argv[(long)iVar3 + 1]);
          piVar2 = h;
          goto LAB_00101407;
        }
      }
      else {
        iVar1 = strcmp(__s1,"-bpp");
        if (iVar1 == 0) {
          if (argv[(long)iVar3 + 1] != (char *)0x0) {
            iVar1 = atoi(argv[(long)iVar3 + 1]);
            piVar2 = bpp;
            goto LAB_00101407;
          }
        }
        else {
          iVar1 = strcmp(__s1,"-fullscreen");
          if (iVar1 == 0) {
            *(byte *)((long)flags + 3) = *(byte *)((long)flags + 3) | 0x80;
          }
          else {
            iVar1 = strcmp(__s1,"-hw");
            if (iVar1 == 0) {
              *(byte *)flags = (byte)*flags | 1;
            }
            else {
              iVar1 = strcmp(__s1,"-hwpalette");
              if (iVar1 != 0) {
                return iVar3;
              }
              *(byte *)((long)flags + 3) = *(byte *)((long)flags + 3) | 0x20;
            }
          }
        }
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int get_video_args(char *argv[], int *w, int *h, int *bpp, Uint32 *flags)
{
	int i;

	*w = 640;
	*h = 480;
	*bpp = 0;
	*flags = SDL_SWSURFACE;

	for ( i=1; argv[i]; ++i ) {
		if ( strcmp(argv[i], "-width") == 0 ) {
			if ( argv[i+1] ) {
				*w = atoi(argv[++i]);
			}
		} else
		if ( strcmp(argv[i], "-height") == 0 ) {
			if ( argv[i+1] ) {
				*h = atoi(argv[++i]);
			}
		} else
		if ( strcmp(argv[i], "-bpp") == 0 ) {
			if ( argv[i+1] ) {
				*bpp = atoi(argv[++i]);
			}
		} else
		if ( strcmp(argv[i], "-fullscreen") == 0 ) {
			*flags |= SDL_FULLSCREEN;
		} else
		if ( strcmp(argv[i], "-hw") == 0 ) {
			*flags |= SDL_HWSURFACE;
		} else
		if ( strcmp(argv[i], "-hwpalette") == 0 ) {
			*flags |= SDL_HWPALETTE;
		} else
			break;
	}
	return i;
}